

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::BinaryVecOp<4,_true,_true,_false,_rsg::ComputeMulRange,_rsg::EvaluateMul>::evaluate
          (BinaryVecOp<4,_true,_true,_false,_rsg::ComputeMulRange,_rsg::EvaluateMul> *this,
          ExecValueAccess dst,ExecConstValueAccess a,ExecConstValueAccess b)

{
  Type TVar1;
  int iVar2;
  int iVar3;
  VariableType *pVVar4;
  float *pfVar5;
  int *piVar6;
  float fVar7;
  float b_00;
  ConstStridedValueAccess<64> local_b0;
  ConstStridedValueAccess<64> local_a0;
  ConstStridedValueAccess<64> local_90;
  EvaluateMul local_79;
  int local_78;
  int local_74;
  int compNdx_1;
  int elemNdx_1;
  ConstStridedValueAccess<64> local_60;
  ConstStridedValueAccess<64> local_50;
  EvaluateMul local_39;
  int local_38;
  int local_34;
  int compNdx;
  int elemNdx;
  BinaryVecOp<4,_true,_true,_false,_rsg::ComputeMulRange,_rsg::EvaluateMul> *this_local;
  ExecConstValueAccess a_local;
  ExecValueAccess dst_local;
  
  a_local.m_type = (VariableType *)a.m_value;
  this_local = (BinaryVecOp<4,_true,_true,_false,_rsg::ComputeMulRange,_rsg::EvaluateMul> *)a.m_type
  ;
  a_local.m_value = (Scalar *)dst.super_ConstStridedValueAccess<64>.m_type;
  _compNdx = this;
  pVVar4 = ConstStridedValueAccess<64>::getType((ConstStridedValueAccess<64> *)&a_local.m_value);
  TVar1 = VariableType::getBaseType(pVVar4);
  if (TVar1 == TYPE_FLOAT) {
    local_34 = 0;
    while( true ) {
      iVar3 = local_34;
      pVVar4 = ConstStridedValueAccess<64>::getType((ConstStridedValueAccess<64> *)&a_local.m_value)
      ;
      iVar2 = VariableType::getNumElements(pVVar4);
      if (iVar2 <= iVar3) break;
      for (local_38 = 0; local_38 < 0x40; local_38 = local_38 + 1) {
        local_50 = ConstStridedValueAccess<64>::component
                             ((ConstStridedValueAccess<64> *)&this_local,local_34);
        fVar7 = ConstStridedValueAccess<64>::asFloat(&local_50,local_38);
        local_60 = ConstStridedValueAccess<64>::component(&b,local_34);
        b_00 = ConstStridedValueAccess<64>::asFloat(&local_60,local_38);
        fVar7 = EvaluateMul::operator()(&local_39,fVar7,b_00);
        _compNdx_1 = (ConstStridedValueAccess<64>)
                     StridedValueAccess<64>::component
                               ((StridedValueAccess<64> *)&a_local.m_value,local_34);
        pfVar5 = StridedValueAccess<64>::asFloat((StridedValueAccess<64> *)&compNdx_1,local_38);
        *pfVar5 = fVar7;
      }
      local_34 = local_34 + 1;
    }
  }
  else if (TVar1 == TYPE_INT) {
    local_74 = 0;
    while( true ) {
      iVar3 = local_74;
      pVVar4 = ConstStridedValueAccess<64>::getType((ConstStridedValueAccess<64> *)&a_local.m_value)
      ;
      iVar2 = VariableType::getNumElements(pVVar4);
      if (iVar2 <= iVar3) break;
      for (local_78 = 0; local_78 < 0x40; local_78 = local_78 + 1) {
        local_90 = ConstStridedValueAccess<64>::component
                             ((ConstStridedValueAccess<64> *)&this_local,local_74);
        iVar3 = ConstStridedValueAccess<64>::asInt(&local_90,local_78);
        local_a0 = ConstStridedValueAccess<64>::component(&b,local_74);
        iVar2 = ConstStridedValueAccess<64>::asInt(&local_a0,local_78);
        iVar3 = EvaluateMul::operator()(&local_79,iVar3,iVar2);
        local_b0 = (ConstStridedValueAccess<64>)
                   StridedValueAccess<64>::component
                             ((StridedValueAccess<64> *)&a_local.m_value,local_74);
        piVar6 = StridedValueAccess<64>::asInt((StridedValueAccess<64> *)&local_b0,local_78);
        *piVar6 = iVar3;
      }
      local_74 = local_74 + 1;
    }
  }
  return;
}

Assistant:

void BinaryVecOp<Precedence, Float, Int, Bool, ComputeValueRange, EvaluateComp>::evaluate (ExecValueAccess dst, ExecConstValueAccess a, ExecConstValueAccess b)
{
	DE_ASSERT(dst.getType() == a.getType());
	DE_ASSERT(dst.getType() == b.getType());
	switch (dst.getType().getBaseType())
	{
		case VariableType::TYPE_FLOAT:
			for (int elemNdx = 0; elemNdx < dst.getType().getNumElements(); elemNdx++)
			{
				for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
					dst.component(elemNdx).asFloat(compNdx) = EvaluateComp()(a.component(elemNdx).asFloat(compNdx), b.component(elemNdx).asFloat(compNdx));
			}
			break;

		case VariableType::TYPE_INT:
			for (int elemNdx = 0; elemNdx < dst.getType().getNumElements(); elemNdx++)
			{
				for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
					dst.component(elemNdx).asInt(compNdx) = EvaluateComp()(a.component(elemNdx).asInt(compNdx), b.component(elemNdx).asInt(compNdx));
			}
			break;

		default:
			DE_ASSERT(DE_FALSE); // Invalid type for multiplication
	}
}